

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

Unary * __thiscall wasm::Builder::makeUnary(Builder *this,UnaryOp op,Expression *value)

{
  Unary *this_00;
  
  this_00 = (Unary *)MixedArena::allocSpace(&this->wasm->allocator,0x20,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression._id = UnaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)15>).super_Expression.type.id = 0;
  this_00->op = op;
  this_00->value = value;
  Unary::finalize(this_00);
  return this_00;
}

Assistant:

Unary* makeUnary(UnaryOp op, Expression* value) {
    auto* ret = wasm.allocator.alloc<Unary>();
    ret->op = op;
    ret->value = value;
    ret->finalize();
    return ret;
  }